

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.c
# Opt level: O3

int mbedtls_asn1_get_sequence_of(uchar **p,uchar *end,mbedtls_asn1_sequence *cur,int tag)

{
  uchar *puVar1;
  int iVar2;
  size_t in_RAX;
  mbedtls_asn1_sequence *pmVar3;
  byte *pbVar4;
  size_t len;
  size_t local_28;
  
  puVar1 = *p;
  if (end == puVar1 || (long)end - (long)puVar1 < 0) {
LAB_0014bd49:
    iVar2 = -0x60;
  }
  else if (*puVar1 == '0') {
    *p = puVar1 + 1;
    local_28 = in_RAX;
    iVar2 = mbedtls_asn1_get_len(p,end,&local_28);
    if (iVar2 == 0) {
      pbVar4 = *p;
      iVar2 = -0x66;
      if (pbVar4 + local_28 == end) {
        while (pbVar4 < end) {
          (cur->buf).tag = (uint)*pbVar4;
          if (end == pbVar4 || (long)end - (long)pbVar4 < 0) goto LAB_0014bd49;
          if ((uint)*pbVar4 != tag) goto LAB_0014bd50;
          *p = pbVar4 + 1;
          iVar2 = mbedtls_asn1_get_len(p,end,&(cur->buf).len);
          if (iVar2 != 0) {
            return iVar2;
          }
          puVar1 = *p;
          (cur->buf).p = puVar1;
          pbVar4 = puVar1 + (cur->buf).len;
          *p = pbVar4;
          if (pbVar4 < end) {
            pmVar3 = (mbedtls_asn1_sequence *)calloc(1,0x20);
            cur->next = pmVar3;
            if (pmVar3 == (mbedtls_asn1_sequence *)0x0) {
              return -0x6a;
            }
            pbVar4 = *p;
            cur = pmVar3;
          }
        }
        cur->next = (mbedtls_asn1_sequence *)0x0;
        iVar2 = -0x66;
        if (*p == end) {
          iVar2 = 0;
        }
      }
    }
  }
  else {
LAB_0014bd50:
    iVar2 = -0x62;
  }
  return iVar2;
}

Assistant:

int mbedtls_asn1_get_sequence_of( unsigned char **p,
                          const unsigned char *end,
                          mbedtls_asn1_sequence *cur,
                          int tag)
{
    int ret;
    size_t len;
    mbedtls_asn1_buf *buf;

    /* Get main sequence tag */
    if( ( ret = mbedtls_asn1_get_tag( p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
        return( ret );

    if( *p + len != end )
        return( MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

    while( *p < end )
    {
        buf = &(cur->buf);
        buf->tag = **p;

        if( ( ret = mbedtls_asn1_get_tag( p, end, &buf->len, tag ) ) != 0 )
            return( ret );

        buf->p = *p;
        *p += buf->len;

        /* Allocate and assign next pointer */
        if( *p < end )
        {
            cur->next = mbedtls_calloc( 1, sizeof( mbedtls_asn1_sequence ) );

            if( cur->next == NULL )
                return( MBEDTLS_ERR_ASN1_ALLOC_FAILED );

            cur = cur->next;
        }
    }

    /* Set final sequence entry's next pointer to NULL */
    cur->next = NULL;

    if( *p != end )
        return( MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

    return( 0 );
}